

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::PathArcToFast(ImDrawList *this,ImVec2 *centre,float radius,int amin,int amax)

{
  int *piVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  ImVec2 *pIVar5;
  ImGuiContext *pIVar6;
  ImVec2 *pIVar7;
  int iVar8;
  int iVar9;
  int i;
  int iVar10;
  long lVar11;
  int a;
  float fVar12;
  float fVar13;
  
  if (PathArcToFast(ImVec2_const&,float,int,int)::circle_vtx == '\0') {
    PathArcToFast();
  }
  if (PathArcToFast(ImVec2_const&,float,int,int)::circle_vtx_builds == '\0') {
    lVar11 = 0;
    do {
      fVar12 = (float)(int)lVar11 / 12.0;
      fVar12 = (fVar12 + fVar12) * 3.1415927;
      fVar13 = cosf(fVar12);
      PathArcToFast::circle_vtx[lVar11].x = fVar13;
      fVar12 = sinf(fVar12);
      PathArcToFast::circle_vtx[lVar11].y = fVar12;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0xc);
    PathArcToFast(ImVec2_const&,float,int,int)::circle_vtx_builds = '\x01';
  }
  pIVar6 = GImGui;
  if (amin <= amax) {
    iVar9 = (this->_Path).Size;
    if ((radius != 0.0) || (NAN(radius))) {
      iVar9 = (amax - amin) + iVar9 + 1;
      if ((this->_Path).Capacity < iVar9) {
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + 1;
        pIVar7 = (ImVec2 *)(*(pIVar6->IO).MemAllocFn)((long)iVar9 << 3);
        pIVar5 = (this->_Path).Data;
        if (pIVar5 != (ImVec2 *)0x0) {
          memcpy(pIVar7,pIVar5,(long)(this->_Path).Size << 3);
        }
        pIVar5 = (this->_Path).Data;
        if (pIVar5 != (ImVec2 *)0x0) {
          piVar1 = &(GImGui->IO).MetricsAllocs;
          *piVar1 = *piVar1 + -1;
        }
        (*(GImGui->IO).MemFreeFn)(pIVar5);
        (this->_Path).Data = pIVar7;
        (this->_Path).Capacity = iVar9;
      }
      if (amin <= amax) {
        do {
          pIVar6 = GImGui;
          iVar9 = amin + (((uint)(amin / 6 + (amin >> 0x1f)) >> 1) - (amin >> 0x1f)) * -0xc;
          fVar12 = PathArcToFast::circle_vtx[iVar9].x;
          fVar13 = centre->x;
          fVar2 = PathArcToFast::circle_vtx[iVar9].y;
          fVar3 = centre->y;
          iVar9 = (this->_Path).Size;
          iVar4 = (this->_Path).Capacity;
          if (iVar9 == iVar4) {
            if (iVar4 == 0) {
              iVar8 = 8;
            }
            else {
              iVar8 = iVar4 / 2 + iVar4;
            }
            iVar9 = iVar9 + 1;
            if (iVar9 < iVar8) {
              iVar9 = iVar8;
            }
            if (iVar4 < iVar9) {
              piVar1 = &(GImGui->IO).MetricsAllocs;
              *piVar1 = *piVar1 + 1;
              pIVar7 = (ImVec2 *)(*(pIVar6->IO).MemAllocFn)((long)iVar9 << 3);
              pIVar5 = (this->_Path).Data;
              if (pIVar5 != (ImVec2 *)0x0) {
                memcpy(pIVar7,pIVar5,(long)(this->_Path).Size << 3);
              }
              pIVar5 = (this->_Path).Data;
              if (pIVar5 != (ImVec2 *)0x0) {
                piVar1 = &(GImGui->IO).MetricsAllocs;
                *piVar1 = *piVar1 + -1;
              }
              (*(GImGui->IO).MemFreeFn)(pIVar5);
              (this->_Path).Data = pIVar7;
              (this->_Path).Capacity = iVar9;
            }
          }
          pIVar5 = (this->_Path).Data;
          iVar9 = (this->_Path).Size;
          (this->_Path).Size = iVar9 + 1;
          pIVar5[iVar9].x = fVar12 * radius + fVar13;
          pIVar5[iVar9].y = fVar2 * radius + fVar3;
          amin = amin + 1;
        } while (amax + 1 != amin);
      }
    }
    else {
      iVar4 = (this->_Path).Capacity;
      if (iVar9 == iVar4) {
        if (iVar4 == 0) {
          iVar8 = 8;
        }
        else {
          iVar8 = iVar4 / 2 + iVar4;
        }
        iVar10 = iVar9 + 1;
        if (iVar9 + 1 < iVar8) {
          iVar10 = iVar8;
        }
        if (iVar4 < iVar10) {
          piVar1 = &(GImGui->IO).MetricsAllocs;
          *piVar1 = *piVar1 + 1;
          pIVar7 = (ImVec2 *)(*(pIVar6->IO).MemAllocFn)((long)iVar10 << 3);
          pIVar5 = (this->_Path).Data;
          if (pIVar5 != (ImVec2 *)0x0) {
            memcpy(pIVar7,pIVar5,(long)(this->_Path).Size << 3);
          }
          pIVar5 = (this->_Path).Data;
          if (pIVar5 != (ImVec2 *)0x0) {
            piVar1 = &(GImGui->IO).MetricsAllocs;
            *piVar1 = *piVar1 + -1;
          }
          (*(GImGui->IO).MemFreeFn)(pIVar5);
          (this->_Path).Data = pIVar7;
          (this->_Path).Capacity = iVar10;
        }
      }
      iVar9 = (this->_Path).Size;
      (this->_Path).Size = iVar9 + 1;
      (this->_Path).Data[iVar9] = *centre;
    }
  }
  return;
}

Assistant:

void ImDrawList::PathArcToFast(const ImVec2& centre, float radius, int amin, int amax)
{
    static ImVec2 circle_vtx[12];
    static bool circle_vtx_builds = false;
    const int circle_vtx_count = IM_ARRAYSIZE(circle_vtx);
    if (!circle_vtx_builds)
    {
        for (int i = 0; i < circle_vtx_count; i++)
        {
            const float a = ((float)i / (float)circle_vtx_count) * 2*IM_PI;
            circle_vtx[i].x = cosf(a);
            circle_vtx[i].y = sinf(a);
        }
        circle_vtx_builds = true;
    }

    if (amin > amax) return;
    if (radius == 0.0f)
    {
        _Path.push_back(centre);
    }
    else
    {
        _Path.reserve(_Path.Size + (amax - amin + 1));
        for (int a = amin; a <= amax; a++)
        {
            const ImVec2& c = circle_vtx[a % circle_vtx_count];
            _Path.push_back(ImVec2(centre.x + c.x * radius, centre.y + c.y * radius));
        }
    }
}